

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O1

char * cmSHA384_Data(sha_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA_CTX context;
  SHA_CTX local_f8;
  
  local_f8.s512.state[6] = 0xdb0c2e0d64f98fa7;
  local_f8.s512.state[7] = 0x47b5481dbefa4fa4;
  local_f8.s256.bitcount = 0x67332667ffc00b31;
  local_f8.s512.state[5] = 0x8eb44a8768581511;
  local_f8.s512.state[2] = 0x9159015a3070dd17;
  local_f8.s1.bitcount = 0x152fecd8f70e5939;
  local_f8.s512.state[0] = 0xcbbb9d5dc1059ed8;
  local_f8.s512.state[1] = 0x629a292a367cd507;
  memset(local_f8.s1.buffer + 0x20,0,0x90);
  cmSHA512_Update(&local_f8,data,len);
  pcVar1 = cmSHA384_End(&local_f8,digest);
  return pcVar1;
}

Assistant:

char* SHA384_Data(const sha_byte* data, size_t len, char digest[SHA384_DIGEST_STRING_LENGTH]) {
	SHA_CTX	context;

	SHA384_Init(&context);
	SHA384_Update(&context, data, len);
	return SHA384_End(&context, digest);
}